

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadCodeElimination.cpp
# Opt level: O1

void __thiscall
wasm::DeadCodeElimination::visitExpression(DeadCodeElimination *this,Expression *curr)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Id IVar1;
  uintptr_t uVar2;
  byte bVar3;
  Builder BVar4;
  Index IVar5;
  Index IVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  Drop *this_01;
  Block *expression;
  Expression ***pppEVar9;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  pointer extraout_RDX_02;
  pointer pppEVar10;
  pointer extraout_RDX_03;
  bool bVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  Expression *pEVar15;
  ulong uVar16;
  int iVar17;
  TypeUpdater *this_02;
  Index IVar18;
  bool bVar19;
  optional<wasm::Type> type;
  Expression *local_c0;
  Expression *child;
  TypeUpdater *local_b0;
  AbstractChildIterator<wasm::ChildIterator> local_a8;
  Builder local_68;
  Builder builder;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> remainingChildren;
  
  IVar1 = curr->_id;
  if (IVar1 < PopId) {
    if (IVar1 == BlockId) {
      this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(curr + 2);
      uVar16 = curr[2].type.id;
      if (uVar16 != 0) {
        uVar7 = 0;
        uVar13 = 1;
        do {
          uVar12 = (uint)uVar13;
          if ((this_00->data[uVar7]->type).id == 1) goto LAB_00842c30;
          bVar11 = uVar13 < uVar16;
          uVar7 = uVar13;
          uVar13 = (ulong)(uVar12 + 1);
        } while (bVar11);
      }
      uVar12 = 0;
LAB_00842c30:
      if (uVar12 != 0) {
        uVar16 = (ulong)uVar12;
        if (uVar16 < curr[2].type.id) {
          uVar7 = uVar16;
          do {
            uVar12 = uVar12 + 1;
            TypeUpdater::noteRecursiveRemoval
                      (&this->typeUpdater,*(Expression **)(*(long *)(curr + 2) + uVar7 * 8));
            uVar7 = (ulong)uVar12;
          } while (uVar7 < curr[2].type.id);
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize(this_00,uVar16)
        ;
        if ((curr[2].type.id == 1) && (pEVar15 = *this_00->data, pEVar15->_id == UnreachableId))
        goto LAB_00842d4d;
      }
      if ((curr->type).id < 2) {
        return;
      }
      uVar2 = curr[2].type.id;
      if (uVar2 == 0) {
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xd0,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      if ((this_00->data[uVar2 - 1]->type).id != 1) {
        return;
      }
      if ((curr[1].type.id != 0) &&
         (pmVar8 = std::
                   map<wasm::Name,_wasm::TypeUpdater::BlockInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
                   ::operator[](&(this->typeUpdater).blockInfos,(key_type *)(curr + 1)),
         0 < pmVar8->numBreaks)) {
        return;
      }
      if ((curr->type).id == 1) {
        return;
      }
      goto LAB_00842f51;
    }
    if (IVar1 != IfId) {
      if (IVar1 != LoopId) goto LAB_00842b63;
      pEVar15 = *(Expression **)(curr + 2);
      if (pEVar15->_id != UnreachableId) {
        return;
      }
LAB_00842d4d:
      replaceCurrent(this,pEVar15);
      return;
    }
    if (*(long *)(*(long *)(curr + 1) + 8) == 1) {
      TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,(Expression *)curr[1].type.id);
      if (*(Expression **)(curr + 2) != (Expression *)0x0) {
        TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,*(Expression **)(curr + 2));
      }
      pEVar15 = *(Expression **)(curr + 1);
      goto LAB_00842d4d;
    }
    if ((curr->type).id == 1) {
      return;
    }
    lVar14 = *(long *)(curr + 2);
    if (lVar14 == 0) {
      return;
    }
    if (*(long *)(curr[1].type.id + 8) != 1) {
      return;
    }
  }
  else {
    if (1 < IVar1 - 0x34) {
      if (IVar1 == PopId) {
        this->hasPop = true;
      }
LAB_00842b63:
      if ((curr->type).id == 1) {
        AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_a8,curr);
        iVar17 = (int)((ulong)((long)local_a8.children.flexible.
                                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_a8.children.flexible.
                                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                 (int)local_a8.children.usedFixed;
        builder.wasm = (Module *)this;
        if (iVar17 == 0) {
          bVar11 = false;
        }
        else {
          IVar18 = 0;
          do {
            IVar5 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_a8,IVar18);
            pppEVar9 = local_a8.children.flexible.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data._M_start + ((ulong)IVar5 - 4);
            if (IVar5 < 4) {
              pppEVar9 = local_a8.children.fixed._M_elems + IVar5;
            }
            bVar11 = false;
            if (((**pppEVar9)->type).id == 1) {
              bVar11 = true;
              break;
            }
            bVar19 = iVar17 - 1U != IVar18;
            IVar18 = IVar18 + 1;
          } while (bVar19);
        }
        BVar4.wasm = builder.wasm;
        if (local_a8.children.flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a8.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar11) {
          local_68.wasm = (Module *)((BVar4.wasm)->debugInfoSourceRoot)._M_string_length;
          auStack_58 = (undefined1  [8])0x0;
          remainingChildren.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          remainingChildren.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_a8,curr);
          IVar18 = (int)((ulong)((long)local_a8.children.flexible.
                                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_a8.children.flexible.
                                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                   (int)local_a8.children.usedFixed;
          pppEVar10 = extraout_RDX;
          if (IVar18 != 0) {
            this_02 = (TypeUpdater *)&((builder.wasm)->debugInfoSourceRoot).field_2;
            bVar11 = false;
            IVar5 = 0;
            local_b0 = this_02;
            do {
              IVar6 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_a8,IVar5);
              pppEVar9 = local_a8.children.flexible.
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                         ._M_impl.super__Vector_impl_data._M_start + ((ulong)IVar6 - 4);
              if (IVar6 < 4) {
                pppEVar9 = local_a8.children.fixed._M_elems + IVar6;
              }
              pEVar15 = **pppEVar9;
              local_c0 = pEVar15;
              if (bVar11) {
                TypeUpdater::noteRecursiveRemoval(this_02,pEVar15);
                pppEVar10 = extraout_RDX_00;
              }
              else if ((pEVar15->type).id == 1) {
                if (remainingChildren.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    remainingChildren.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  bVar11 = true;
                  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                  _M_realloc_insert<wasm::Expression*const&>
                            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                             auStack_58,
                             (iterator)
                             remainingChildren.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,&local_c0);
                  pppEVar10 = extraout_RDX_02;
                }
                else {
                  *remainingChildren.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start = pEVar15;
                  remainingChildren.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       remainingChildren.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1;
                  bVar11 = true;
                  pppEVar10 = local_a8.children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                }
              }
              else {
                this_01 = (Drop *)MixedArena::allocSpace(&(local_68.wasm)->allocator,0x18,8);
                (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
                     DropId;
                (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.
                id = 0;
                this_01->value = pEVar15;
                Drop::finalize(this_01);
                child = (Expression *)this_01;
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58
                           ,&child);
                pppEVar10 = extraout_RDX_01;
                this_02 = local_b0;
              }
              IVar5 = IVar5 + 1;
            } while (IVar18 != IVar5);
          }
          if (local_a8.children.flexible.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8.children.flexible.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.children.flexible.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            pppEVar10 = extraout_RDX_03;
          }
          BVar4.wasm = builder.wasm;
          if ((long)remainingChildren.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 == 8) {
            expression = *(Block **)auStack_58;
          }
          else {
            *(undefined1 *)((long)&((builder.wasm)->memoriesMap)._M_h._M_buckets + 1) = 1;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)pppEVar10;
            expression = Builder::
                         makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                                   (&local_68,
                                    (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)auStack_58,type);
          }
          replaceCurrent((DeadCodeElimination *)BVar4.wasm,(Expression *)expression);
          if (auStack_58 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_58,
                            (long)remainingChildren.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
          }
        }
      }
      return;
    }
    if (curr != (Expression *)0x0 && IVar1 == TryId) {
      if (*(long *)(curr + 5) == 0) {
        bVar3 = 1;
      }
      else {
        bVar3 = 1;
        lVar14 = 0;
        do {
          bVar3 = bVar3 & *(long *)(*(long *)(curr[4].type.id + lVar14 * 8) + 8) == 1;
          lVar14 = lVar14 + 1;
        } while (*(long *)(curr + 5) != lVar14);
      }
      if ((curr->type).id == 1) {
        return;
      }
      if (!(bool)(*(long *)(*(long *)(curr + 2) + 8) == 1 & bVar3)) {
        return;
      }
      goto LAB_00842f51;
    }
    if ((curr == (Expression *)0x0) || (IVar1 != TryTableId)) {
      handle_unreachable("unimplemented DCE control flow structure",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeadCodeElimination.cpp"
                         ,0xc3);
    }
    if ((curr->type).id == 1) {
      return;
    }
    lVar14 = *(long *)(curr + 1);
  }
  if (*(long *)(lVar14 + 8) != 1) {
    return;
  }
LAB_00842f51:
  (curr->type).id = 1;
  TypeUpdater::propagateTypesUp(&this->typeUpdater,curr);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    if (curr->is<Pop>()) {
      hasPop = true;
    }

    if (!Properties::isControlFlowStructure(curr)) {
      // Control flow structures require special handling, but others are
      // simple.
      if (curr->type == Type::unreachable) {
        // This may be dead code. Check if there is an unreachable child.
        bool hasUnreachableChild = false;
        for (auto* child : ChildIterator(curr)) {
          if (child->type == Type::unreachable) {
            hasUnreachableChild = true;
            break;
          }
        }
        if (hasUnreachableChild) {
          // This is indeed unreachable code, made unreachable by that child.
          Builder builder(*getModule());
          std::vector<Expression*> remainingChildren;
          bool afterUnreachable = false;
          for (auto* child : ChildIterator(curr)) {
            if (afterUnreachable) {
              typeUpdater.noteRecursiveRemoval(child);
              continue;
            }
            if (child->type == Type::unreachable) {
              remainingChildren.push_back(child);
              afterUnreachable = true;
            } else {
              remainingChildren.push_back(builder.makeDrop(child));
            }
          }
          if (remainingChildren.size() == 1) {
            replaceCurrent(remainingChildren[0]);
          } else {
            addedBlock = true;
            replaceCurrent(builder.makeBlock(remainingChildren));
          }
        }
      }
      return;
    }
    // This is a control flow structure.
    if (auto* block = curr->dynCast<Block>()) {
      auto& list = block->list;
      // The index from which to remove, which is one after the first
      // unreachable instruction. Note that 0 is not a valid value, so we can
      // use it as such.
      Index removeFromHere = 0;
      for (Index i = 0; i < list.size(); i++) {
        if (list[i]->type == Type::unreachable) {
          removeFromHere = i + 1;
          break;
        }
      }
      if (removeFromHere != 0) {
        for (Index i = removeFromHere; i < list.size(); i++) {
          typeUpdater.noteRecursiveRemoval(list[i]);
        }
        list.resize(removeFromHere);
        if (list.size() == 1 && list[0]->is<Unreachable>()) {
          replaceCurrent(list[0]);
          return;
        }
      }
      // Finally, if there is no need for a concrete type (which is when there
      // is one marked, but nothing breaks to it, and also the block does not
      // have a concrete value flowing out) then remove it, which may allow
      // more reduction.
      if (block->type.isConcrete() && list.back()->type == Type::unreachable &&
          !typeUpdater.hasBreaks(block)) {
        typeUpdater.changeType(block, Type::unreachable);
      }
    } else if (auto* iff = curr->dynCast<If>()) {
      if (iff->condition->type == Type::unreachable) {
        typeUpdater.noteRecursiveRemoval(iff->ifTrue);
        if (iff->ifFalse) {
          typeUpdater.noteRecursiveRemoval(iff->ifFalse);
        }
        replaceCurrent(iff->condition);
        return;
      }
      // If both arms are unreachable, there is no need for a concrete type,
      // which may allow more reduction.
      if (iff->type != Type::unreachable && iff->ifFalse &&
          iff->ifTrue->type == Type::unreachable &&
          iff->ifFalse->type == Type::unreachable) {
        typeUpdater.changeType(iff, Type::unreachable);
      }
    } else if (auto* loop = curr->dynCast<Loop>()) {
      // The loop body may have unreachable type if it branches back to the
      // loop top, for example. The only case we look for here is where we've
      // already removed the entire body as dead code.
      if (loop->body->is<Unreachable>()) {
        replaceCurrent(loop->body);
      }
    } else if (auto* tryy = curr->dynCast<Try>()) {
      // If both try body and catch body are unreachable, there is no need for a
      // concrete type, which may allow more reduction.
      bool allCatchesUnreachable = true;
      for (auto* catchBody : tryy->catchBodies) {
        allCatchesUnreachable &= catchBody->type == Type::unreachable;
      }
      if (tryy->type != Type::unreachable &&
          tryy->body->type == Type::unreachable && allCatchesUnreachable) {
        typeUpdater.changeType(tryy, Type::unreachable);
      }
    } else if (auto* tryTable = curr->dynCast<TryTable>()) {
      // try_table can finish normally only if its body finishes normally.
      if (tryTable->type != Type::unreachable &&
          tryTable->body->type == Type::unreachable) {
        typeUpdater.changeType(tryTable, Type::unreachable);
      }
    } else {
      WASM_UNREACHABLE("unimplemented DCE control flow structure");
    }
  }